

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O0

void __thiscall cab::update_position(cab *this,node_type position)

{
  ulong uVar1;
  node_type nVar2;
  uint32_t uVar3;
  size_type sVar4;
  reference pvVar5;
  __normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_> local_38;
  __normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_> local_30;
  const_iterator local_28;
  ulong local_20;
  size_t i;
  cab *pcStack_10;
  node_type position_local;
  cab *this_local;
  
  i._7_1_ = position;
  pcStack_10 = this;
  cab_manager::update_cab(this->_cab_manager,this->_id,this->_position,position);
  this->_position = i._7_1_;
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    sVar4 = std::vector<request,_std::allocator<request>_>::size(&this->_requests);
    if (sVar4 <= uVar1) break;
    pvVar5 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,local_20);
    nVar2 = request::src(pvVar5);
    if (nVar2 == i._7_1_) {
      pvVar5 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,local_20)
      ;
      uVar3 = request::passengers(pvVar5);
      this->_passengers = uVar3 + this->_passengers;
      pvVar5 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,local_20)
      ;
      request::pick_up(pvVar5);
    }
    pvVar5 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,local_20);
    nVar2 = request::dst(pvVar5);
    if (nVar2 == i._7_1_) {
      pvVar5 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,local_20)
      ;
      uVar3 = request::passengers(pvVar5);
      this->_passengers = this->_passengers - uVar3;
      local_38._M_current =
           (request *)std::vector<request,_std::allocator<request>_>::begin(&this->_requests);
      local_30 = __gnu_cxx::
                 __normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>::
                 operator+(&local_38,local_20);
      __gnu_cxx::__normal_iterator<request_const*,std::vector<request,std::allocator<request>>>::
      __normal_iterator<request*>
                ((__normal_iterator<request_const*,std::vector<request,std::allocator<request>>> *)
                 &local_28,&local_30);
      std::vector<request,_std::allocator<request>_>::erase(&this->_requests,local_28);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void cab::update_position(node_type position)
{
    _cab_manager->update_cab(_id, _position, position);
    _position = position;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == position)
        {
            _passengers += _requests[i].passengers();
            _requests[i].pick_up();
        }

        if(_requests[i].dst() == position)
        {
            _passengers -= _requests[i].passengers();
            _requests.erase(_requests.begin() + i);
        }
    }
}